

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.hpp
# Opt level: O2

void __thiscall
sisl::vertex3::vertex3(vertex3 *this,double *x,double *y,double *z,double *i,double *j,double *k)

{
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_60;
  double *local_40;
  double *local_38;
  
  local_60.m_xpr._0_4_ = 3;
  local_40 = j;
  local_38 = i;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&this->p,(int *)&local_60);
  local_60.m_xpr._0_4_ = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&this->n,(int *)&local_60);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            (&local_60,&this->p,x);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(&local_60,y);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar1,z);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_60);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            (&local_60,&this->n,local_38);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_60,local_40);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar1,k);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_60);
  return;
}

Assistant:

vertex3(
            const double &x, const double &y, const double &z, 
            const double &i, const double &j, const double &k) : p(vector(3)), n(vector(3)) {
            p << x,y,z;
            n << i,j,k;
        }